

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O1

Lpk_Fun_t * Lpk_DsdSplit(Lpk_Man_t *pMan,Lpk_Fun_t *p,char *pCofVars,int nCofVars,uint uBoundSet)

{
  bool bVar1;
  int i;
  int iVar2;
  Kit_DsdNtk_t *pNtk;
  Lpk_Fun_t *p_00;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  Lpk_Man_t *pLVar7;
  uint *puVar8;
  ulong uVar9;
  uint local_6c;
  
  puVar8 = pMan->ppTruths[0][0];
  uVar5 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar3 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
  if (uVar5 < 6) {
    uVar3 = 1;
  }
  do {
    puVar8[uVar3 - 1] = *(uint *)(p->pFanins + uVar3 * 4 + 0xc);
    bVar1 = 1 < (long)uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar1);
  local_6c = 0;
  do {
    if ((uBoundSet >> (local_6c & 0x1f) & 1) != 0) goto LAB_004dd377;
    local_6c = local_6c + 1;
  } while (local_6c != 0x20);
  local_6c = 0xffffffff;
LAB_004dd377:
  uVar3 = (ulong)(uint)nCofVars;
  if (0 < nCofVars) {
    uVar9 = 0;
    pLVar7 = pMan;
    do {
      if (uVar9 != 0x1f) {
        uVar5 = 1 << ((byte)uVar9 & 0x1f);
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        lVar6 = 0;
        do {
          Kit_TruthCofactor0New
                    (*(uint **)((long)pLVar7->ppTruths[1] + lVar6 * 2),
                     *(uint **)((long)pLVar7->ppTruths[0] + lVar6),
                     *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[uVar9]);
          Kit_TruthCofactor1New
                    (*(uint **)((long)pLVar7->ppTruths[1] + lVar6 * 2 + 8),
                     *(uint **)((long)pLVar7->ppTruths[0] + lVar6),
                     *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[uVar9]);
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar5 * 8 != lVar6);
      }
      uVar9 = uVar9 + 1;
      pLVar7 = (Lpk_Man_t *)(pLVar7->pCuts[0].pLeaves + 0x11);
    } while (uVar9 != uVar3);
  }
  if (nCofVars != 0x1f) {
    uVar5 = 1 << ((byte)nCofVars & 0x1f);
    uVar9 = 1;
    if (1 < (int)uVar5) {
      uVar9 = (ulong)uVar5;
    }
    uVar4 = 0;
    do {
      pNtk = Kit_DsdDecomposeExpand
                       (pMan->ppTruths[nCofVars][uVar4],*(uint *)&p->field_0x8 >> 7 & 0x1f);
      Kit_DsdTruthPartialTwo
                (pMan->pDsdMan,pNtk,uBoundSet,local_6c,pMan->ppTruths[nCofVars + 1][uVar4],
                 pMan->ppTruths[nCofVars + 1][(long)(int)uVar5 + uVar4]);
      Kit_DsdNtkFree(pNtk);
      uVar4 = uVar4 + 1;
    } while (uVar9 != uVar4);
  }
  if (0 < nCofVars) {
    puVar8 = pMan->pCuts[0].uSign + uVar3 * 0x20 + -0xb;
    do {
      if (uVar3 != 0x1f) {
        uVar5 = 1 << ((byte)uVar3 & 0x1f);
        if ((int)uVar5 < 2) {
          uVar5 = 1;
        }
        lVar6 = 0;
        do {
          Kit_TruthMuxVar(*(uint **)((long)puVar8 + lVar6 + 0x7dbfb0),
                          *(uint **)((long)puVar8 + lVar6 * 2 + 0x7dc030),
                          *(uint **)((long)puVar8 + lVar6 * 2 + 0x7dc038),
                          *(uint *)&p->field_0x8 >> 7 & 0x1f,(int)pCofVars[uVar3 - 1]);
          lVar6 = lVar6 + 8;
        } while ((ulong)uVar5 * 8 != lVar6);
      }
      puVar8 = puVar8 + -0x20;
      bVar1 = 1 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar1);
  }
  p_00 = Lpk_FunDup(p,pMan->ppTruths[1][1]);
  puVar8 = pMan->ppTruths[1][0];
  uVar5 = *(uint *)&p->field_0x8 >> 7 & 0x1f;
  uVar3 = (ulong)(uint)(1 << ((char)uVar5 - 5U & 0x1f));
  if (uVar5 < 6) {
    uVar3 = 1;
  }
  do {
    *(uint *)(p->pFanins + uVar3 * 4 + 0xc) = puVar8[uVar3 - 1];
    bVar1 = 1 < (long)uVar3;
    uVar3 = uVar3 - 1;
  } while (bVar1);
  uVar5 = Kit_TruthSupport((uint *)&p->field_0xe4,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  p->uSupp = uVar5;
  lVar6 = (long)(int)local_6c;
  p->pFanins[lVar6] = p_00->field_0x8 & 0x7f;
  iVar2 = Lpk_SuppDelay(p_00->uSupp,p_00->pDelays);
  p->pDelays[lVar6] = iVar2;
  p->field_0xb = p->field_0xb & 0xbf;
  Lpk_FunSuppMinimize(p);
  Lpk_FunSuppMinimize(p_00);
  p_00->nDelayLim = p->pDelays[lVar6];
  *(uint *)&p_00->field_0x8 = *(uint *)&p_00->field_0x8 & 0xc000ffff | 0x10000;
  *(uint *)&p->field_0x8 =
       *(uint *)&p->field_0x8 & 0xc000ffff | *(uint *)&p->field_0x8 + 0x3fff0000 & 0x3fff0000;
  return p_00;
}

Assistant:

Lpk_Fun_t * Lpk_DsdSplit( Lpk_Man_t * pMan, Lpk_Fun_t * p, char * pCofVars, int nCofVars, unsigned uBoundSet )
{
    Lpk_Fun_t * pNew;
    Kit_DsdNtk_t * pNtkDec;
    int i, k, iVacVar, nCofs;
    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth(p, 0), p->nVars );
    // get the vacuous variable
    iVacVar = Kit_WordFindFirstBit( uBoundSet );
    // compute the cofactors
    for ( i = 0; i < nCofVars; i++ )
        for ( k = 0; k < (1<<i); k++ )
        {
            Kit_TruthCofactor0New( pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
            Kit_TruthCofactor1New( pMan->ppTruths[i+1][2*k+1], pMan->ppTruths[i][k], p->nVars, pCofVars[i] );
        }
    // decompose each cofactor w.r.t. the bound set
    nCofs = (1<<nCofVars);
    for ( k = 0; k < nCofs; k++ )
    {
        pNtkDec = Kit_DsdDecomposeExpand( pMan->ppTruths[nCofVars][k], p->nVars );
        Kit_DsdTruthPartialTwo( pMan->pDsdMan, pNtkDec, uBoundSet, iVacVar, pMan->ppTruths[nCofVars+1][k], pMan->ppTruths[nCofVars+1][nCofs+k] );
        Kit_DsdNtkFree( pNtkDec );
    }
    // compute the composition/decomposition functions (they will be in pMan->ppTruths[1][0]/pMan->ppTruths[1][1])
    for ( i = nCofVars; i >= 1; i-- )
        for ( k = 0; k < (1<<i); k++ )
            Kit_TruthMuxVar( pMan->ppTruths[i][k], pMan->ppTruths[i+1][2*k+0], pMan->ppTruths[i+1][2*k+1], p->nVars, pCofVars[i-1] );

    // derive the new component (decomposition function)
    pNew = Lpk_FunDup( p, pMan->ppTruths[1][1] );
    // update the old component (composition function)
    Kit_TruthCopy( Lpk_FunTruth(p, 0), pMan->ppTruths[1][0], p->nVars );
    p->uSupp = Kit_TruthSupport( Lpk_FunTruth(p, 0), p->nVars );
    p->pFanins[iVacVar] = pNew->Id;
    p->pDelays[iVacVar] = Lpk_SuppDelay( pNew->uSupp, pNew->pDelays );
    // support minimize both
    p->fSupports = 0;
    Lpk_FunSuppMinimize( p );
    Lpk_FunSuppMinimize( pNew );
    // update delay and area requirements
    pNew->nDelayLim = p->pDelays[iVacVar];
    pNew->nAreaLim = 1;
    p->nAreaLim = p->nAreaLim - 1;
    return pNew;
}